

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test0.cpp
# Opt level: O2

bool Create_OP_x64_push_pop(JitFuncCreater *jfc,Regs *regs)

{
  byte *pbVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1;
  byte *pbVar2;
  
  pbVar1 = (regs->rq).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pbVar2 = (regs->rq).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    JitFFI::OpCode_x64::push(jfc,(uint)*pbVar2);
  }
  pbVar1 = (regs->prq).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pbVar2 = (regs->prq).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    JitFFI::OpCode_x64::push(jfc,(uint)*pbVar2);
  }
  pbVar1 = (regs->rq).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pbVar2 = (regs->rq).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    JitFFI::OpCode_x64::pop(jfc,(uint)*pbVar2);
  }
  pbVar1 = (regs->prq).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pbVar2 = (regs->prq).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    JitFFI::OpCode_x64::pop(jfc,(uint)*pbVar2);
  }
  JitFFI::OpCode_x64::push_offset_byte(jfc,prax,'\x05');
  JitFFI::OpCode_x64::push_offset_byte(jfc,pr8,'\x05');
  JitFFI::OpCode_x64::push_offset_u32(jfc,prax,5);
  JitFFI::OpCode_x64::push_offset_u32(jfc,pr8,5);
  JitFFI::OpCode_x64::pop_offset_byte(jfc,prax,'\x05');
  JitFFI::OpCode_x64::pop_offset_byte(jfc,pr8,'\x05');
  JitFFI::OpCode_x64::pop_offset_u32(jfc,prax,5);
  JitFFI::OpCode_x64::pop_offset_u32(jfc,pr8,5);
  return true;
}

Assistant:

bool Create_OP_x64_push_pop(JitFuncCreater &jfc, const Regs &regs)
{
	using namespace OpCode_x64;

	for (byte r : regs.rq)
		push(jfc, static_cast<Register>(r));

	for (byte r : regs.prq)
		push(jfc, static_cast<Register>(r));

	for (byte r : regs.rq)
		pop(jfc, static_cast<Register>(r));

	for (byte r : regs.prq)
		pop(jfc, static_cast<Register>(r));

	push_offset_byte(jfc, prax, 5);
	push_offset_byte(jfc, pr8, 5);
	push_offset_u32(jfc, prax, 5);
	push_offset_u32(jfc, pr8, 5);

	pop_offset_byte(jfc, prax, 5);
	pop_offset_byte(jfc, pr8, 5);
	pop_offset_u32(jfc, prax, 5);
	pop_offset_u32(jfc, pr8, 5);

    return true;
}